

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int __thiscall
fmt::internal::CharTraits<char>::format_float<long_double>
          (CharTraits<char> *this,char *buffer,size_t size,char *format,uint width,int precision,
          longdouble value)

{
  undefined4 in_register_00000084;
  undefined4 local_50;
  undefined4 local_4c;
  longdouble value_local;
  int precision_local;
  uint width_local;
  char *format_local;
  size_t size_local;
  char *buffer_local;
  
  if ((int)format == 0) {
    if ((int)width < 0) {
      local_4c = snprintf((char *)this,(size_t)buffer,(char *)size);
    }
    else {
      local_4c = snprintf((char *)this,(size_t)buffer,(char *)size,(ulong)width,
                          CONCAT44(in_register_00000084,width),precision,value);
    }
    buffer_local._4_4_ = local_4c;
  }
  else {
    if ((int)width < 0) {
      local_50 = snprintf((char *)this,(size_t)buffer,(char *)size,(ulong)format & 0xffffffff,
                          CONCAT44(in_register_00000084,width),precision,value);
    }
    else {
      local_50 = snprintf((char *)this,(size_t)buffer,(char *)size,(ulong)format & 0xffffffff,
                          (ulong)width,precision,value);
    }
    buffer_local._4_4_ = local_50;
  }
  return buffer_local._4_4_;
}

Assistant:

int internal::CharTraits<char>::format_float(
    char *buffer, std::size_t size, const char *format,
    unsigned width, int precision, T value) {
  if (width == 0) {
    return precision < 0 ?
        FMT_SNPRINTF(buffer, size, format, value) :
        FMT_SNPRINTF(buffer, size, format, precision, value);
  }
  return precision < 0 ?
      FMT_SNPRINTF(buffer, size, format, width, value) :
      FMT_SNPRINTF(buffer, size, format, width, precision, value);
}